

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
FastVector<RegVmCmd_*,_false,_false>::grow_and_add
          (FastVector<RegVmCmd_*,_false,_false> *this,uint newSize,RegVmCmd **val)

{
  uint uVar1;
  uint uVar2;
  RegVmCmd **ptr;
  RegVmCmd *pRVar3;
  uint oldMax;
  RegVmCmd **oldData;
  RegVmCmd **val_local;
  uint newSize_local;
  FastVector<RegVmCmd_*,_false,_false> *this_local;
  
  ptr = this->data;
  uVar1 = this->max;
  grow_no_destroy(this,newSize);
  pRVar3 = *val;
  uVar2 = this->count;
  this->count = uVar2 + 1;
  this->data[uVar2] = pRVar3;
  if (ptr != (RegVmCmd **)0x0) {
    NULLC::destruct<RegVmCmd*>(ptr,(ulong)uVar1);
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}